

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::ParseHelper_Decode_Base64
          (AMFImporter *this,string *pInputBase64,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pOutputData)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  runtime_error *this_00;
  char cVar8;
  uint uVar9;
  long lVar10;
  uint8_t i;
  long lVar11;
  size_type sVar12;
  byte *__args;
  uint uVar13;
  uint8_t arr4 [4];
  uint8_t arr3 [3];
  string base64_chars;
  byte local_7b [4];
  byte local_77 [3];
  uint local_74;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             "");
  if ((pInputBase64->_M_string_length & 3) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Base64-encoded data must have size multiply of four.","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (pOutputData,(pInputBase64->_M_string_length >> 2) * 3);
  sVar12 = pInputBase64->_M_string_length;
  if (sVar12 == 0) {
    local_74 = 0;
  }
  else {
    lVar11 = 0;
    local_74 = 0;
    do {
      bVar4 = (pInputBase64->_M_dataplus)._M_p[lVar11];
      if ((char)bVar4 == 0x3d) break;
      iVar6 = isalnum((int)(char)bVar4);
      if (((bVar4 & 0xfb) == 0x2b) || (iVar6 != 0)) {
        cVar8 = (char)local_74 + '\x01';
        local_7b[(ulong)local_74 & 0xff] = bVar4;
        local_74 = CONCAT31((int3)(local_74 >> 8),cVar8);
        if (cVar8 == '\x04') {
          lVar10 = 0;
          do {
            bVar4 = std::__cxx11::string::find
                              ((char)local_70,(ulong)(uint)(int)(char)local_7b[lVar10]);
            local_7b[lVar10] = bVar4;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_77[0] = local_7b[1] >> 4 & 3 | local_7b[0] << 2;
          local_77[1] = local_7b[2] >> 2 & 0xf | local_7b[1] << 4;
          local_77[2] = local_7b[2] * '@' + local_7b[3];
          lVar10 = 0;
          do {
            iVar3._M_current =
                 (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)pOutputData,iVar3,
                         local_77 + lVar10);
            }
            else {
              *iVar3._M_current = local_77[lVar10];
              ppuVar1 = &(pOutputData->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_74 = 0;
        }
      }
      lVar11 = lVar11 + 1;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  bVar4 = (byte)local_74;
  if (bVar4 != 0) {
    uVar13 = local_74 & 0xff;
    if (bVar4 < 4) {
      memset(local_7b + uVar13,0,(ulong)(byte)(4 - bVar4));
    }
    lVar11 = 0;
    do {
      bVar5 = std::__cxx11::string::find((char)local_70,(ulong)(uint)(int)(char)local_7b[lVar11]);
      local_7b[lVar11] = bVar5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    local_77[0] = local_7b[1] >> 4 & 3 | local_7b[0] << 2;
    local_77[1] = local_7b[2] >> 2 & 0xf | local_7b[1] << 4;
    local_77[2] = local_7b[2] * '@' + local_7b[3];
    if (bVar4 != 1) {
      __args = local_77;
      uVar9 = 1;
      do {
        iVar3._M_current =
             (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)pOutputData,iVar3,__args
                    );
        }
        else {
          *iVar3._M_current = *__args;
          ppuVar1 = &(pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar7 = uVar9 & 0xff;
        __args = __args + 1;
        uVar9 = uVar7 + 1;
      } while ((int)uVar7 < (int)(uVar13 - 1));
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseHelper_Decode_Base64(const std::string& pInputBase64, std::vector<uint8_t>& pOutputData) const
{
    // With help from
    // René Nyffenegger http://www.adp-gmbh.ch/cpp/common/base64.html
    const std::string base64_chars = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    uint8_t tidx = 0;
    uint8_t arr4[4], arr3[3];

	// check input data
	if(pInputBase64.size() % 4) throw DeadlyImportError("Base64-encoded data must have size multiply of four.");
	// prepare output place
	pOutputData.clear();
	pOutputData.reserve(pInputBase64.size() / 4 * 3);

	for(size_t in_len = pInputBase64.size(), in_idx = 0; (in_len > 0) && (pInputBase64[in_idx] != '='); in_len--)
	{
		if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		{
			arr4[tidx++] = pInputBase64[in_idx++];
			if(tidx == 4)
			{
				for(tidx = 0; tidx < 4; tidx++) arr4[tidx] = (uint8_t)base64_chars.find(arr4[tidx]);

				arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
				arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
				arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
				for(tidx = 0; tidx < 3; tidx++) pOutputData.push_back(arr3[tidx]);

				tidx = 0;
			}// if(tidx == 4)
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		else
		{
			in_idx++;
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx])) else
	}

	if(tidx)
	{
		for(uint8_t i = tidx; i < 4; i++) arr4[i] = 0;
		for(uint8_t i = 0; i < 4; i++) arr4[i] = (uint8_t)(base64_chars.find(arr4[i]));

		arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
		arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
		arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
		for(uint8_t i = 0; i < (tidx - 1); i++) pOutputData.push_back(arr3[i]);
	}
}